

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManAreFindBestVar(Gia_ManAre_t *p,Gia_PtrAre_t List)

{
  int iVar1;
  uint **ppuVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  uint *puVar9;
  int iVar10;
  bool bVar11;
  int local_44;
  
  iVar1 = p->pAig->nRegs;
  if (iVar1 < 1) {
    local_44 = -1;
  }
  else {
    ppuVar2 = p->ppStas;
    puVar8 = (uint *)((long)(int)(((uint)List & 0xfffff) * p->nSize) * 4 +
                     *(long *)((long)ppuVar2 + (ulong)((uint)List >> 0x11 & 0x3ff8)));
    iVar7 = 0;
    iVar3 = -1;
    local_44 = -1;
    do {
      if (*ppuVar2 == puVar8) {
        iVar10 = 0;
        iVar5 = 0;
        bVar11 = false;
      }
      else {
        bVar4 = (byte)(iVar7 * 2);
        iVar6 = 0;
        iVar5 = 0;
        iVar10 = 0;
        puVar9 = puVar8;
        do {
          if (-1 < (int)*puVar9) {
            if ((puVar9[(long)(iVar7 * 2 >> 5) + 2] & 1 << (bVar4 & 0x1f)) == 0) {
              if ((puVar9[(long)(iVar7 * 2 >> 5) + 2] & 2 << (bVar4 & 0x1f)) == 0) {
                iVar6 = iVar6 + 1;
              }
              else {
                iVar5 = iVar5 + 1;
              }
            }
            else {
              iVar10 = iVar10 + 1;
            }
          }
          puVar9 = (uint *)((long)(int)((puVar9[1] & 0xfffff) * p->nSize) * 4 +
                           *(long *)((long)ppuVar2 + (ulong)(puVar9[1] >> 0x11 & 0x3ff8)));
        } while (*ppuVar2 != puVar9);
        bVar11 = iVar6 != 0;
      }
      if ((iVar10 != 0 || iVar5 != 0) && (iVar10 != 0 && iVar5 != 0 || bVar11)) {
        iVar6 = iVar10 - iVar5;
        if (iVar10 - iVar5 != 0 && iVar5 <= iVar10) {
          iVar6 = -(iVar10 - iVar5);
        }
        iVar6 = iVar5 + iVar10 + iVar6;
        if (iVar3 < iVar6) {
          local_44 = iVar7;
        }
        if (iVar3 <= iVar6) {
          iVar3 = iVar6;
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar1);
  }
  if (local_44 == -1) {
    Gia_ManArePrintListUsed(p,List);
    puts("Error: Best variable not found!!!");
    __assert_fail("iVarBest != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEra2.c"
                  ,0x378,"int Gia_ManAreFindBestVar(Gia_ManAre_t *, Gia_PtrAre_t)");
  }
  return local_44;
}

Assistant:

int Gia_ManAreFindBestVar( Gia_ManAre_t * p, Gia_PtrAre_t List )
{
    Gia_StaAre_t * pCube;
    int Count0, Count1, Count2;
    int iVarThis, iVarBest = -1, WeightThis, WeightBest = -1;
    for ( iVarThis = 0; iVarThis < Gia_ManRegNum(p->pAig); iVarThis++ )
    {
        Count0 = Count1 = Count2 = 0;
        Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, List), pCube )
        {
            if ( Gia_StaIsUnused(pCube) )
                continue;
            if ( Gia_StaHasValue0(pCube, iVarThis) )
                Count0++;
            else if ( Gia_StaHasValue1(pCube, iVarThis) )
                Count1++;
            else
                Count2++;
        }
//        printf( "%4d : %5d  %5d  %5d   Weight = %5d\n", iVarThis, Count0, Count1, Count2, 
//            Count0 + Count1 - (Count0 > Count1 ? Count0 - Count1 : Count1 - Count0) );
        if ( (!Count0 && !Count1) || (!Count0 && !Count2) || (!Count1 && !Count2) )
            continue;
        WeightThis = Count0 + Count1 - (Count0 > Count1 ? Count0 - Count1 : Count1 - Count0);
        if ( WeightBest < WeightThis ) 
        {
            WeightBest = WeightThis;
            iVarBest = iVarThis;
        }
    }
    if ( iVarBest == -1 )
    {
        Gia_ManArePrintListUsed( p, List );
        printf( "Error: Best variable not found!!!\n" );
    }
    assert( iVarBest != -1 );
    return iVarBest;
}